

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMem.c
# Opt level: O0

void Aig_MmStepStop(Aig_MmStep_t *p,int fVerbose)

{
  int local_18;
  int i;
  int fVerbose_local;
  Aig_MmStep_t *p_local;
  
  for (local_18 = 0; local_18 < p->nMems; local_18 = local_18 + 1) {
    Aig_MmFixedStop(p->pMems[local_18],fVerbose);
  }
  if (p->nChunksAlloc != 0) {
    for (local_18 = 0; local_18 < p->nChunks; local_18 = local_18 + 1) {
      if (p->pChunks[local_18] != (char *)0x0) {
        free(p->pChunks[local_18]);
        p->pChunks[local_18] = (char *)0x0;
      }
    }
    if (p->pChunks != (char **)0x0) {
      free(p->pChunks);
      p->pChunks = (char **)0x0;
    }
  }
  if (p->pMems != (Aig_MmFixed_t **)0x0) {
    free(p->pMems);
    p->pMems = (Aig_MmFixed_t **)0x0;
  }
  if (p->pMap != (Aig_MmFixed_t **)0x0) {
    free(p->pMap);
    p->pMap = (Aig_MmFixed_t **)0x0;
  }
  if (p != (Aig_MmStep_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Aig_MmStepStop( Aig_MmStep_t * p, int fVerbose )
{
    int i;
    for ( i = 0; i < p->nMems; i++ )
        Aig_MmFixedStop( p->pMems[i], fVerbose );
    if ( p->nChunksAlloc )
    {
        for ( i = 0; i < p->nChunks; i++ )
            ABC_FREE( p->pChunks[i] );
        ABC_FREE( p->pChunks );
    }
    ABC_FREE( p->pMems );
    ABC_FREE( p->pMap );
    ABC_FREE( p );
}